

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::TypedConfigurations::setValue<el::base::SubsecondPrecision>
          (TypedConfigurations *this,Level level,SubsecondPrecision *value,
          map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
          *confMap,bool includeGlobalLevel)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  Level local_1c;
  pair<el::Level,_el::base::SubsecondPrecision> local_18;
  
  local_1c = level;
  if ((confMap->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0 && includeGlobalLevel) {
    local_18.second.m_width = (*value).m_width;
    local_18.first = Global;
    local_18.second.m_offset = (*value).m_offset;
  }
  else {
    p_Var3 = (confMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      p_Var6 = p_Var3;
      do {
        bVar7 = p_Var6[1]._M_color == _S_red;
        if (!bVar7) {
          p_Var5 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar7];
      } while (p_Var6 != (_Base_ptr)0x0);
      p_Var6 = &p_Var1->_M_header;
      if ((((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_color < 2)) &&
         (iVar9 = -(uint)((*value).m_width == (int)*(undefined8 *)&p_Var5[1].field_0x4),
         iVar10 = -(uint)((*value).m_offset ==
                         (uint)((ulong)*(undefined8 *)&p_Var5[1].field_0x4 >> 0x20)),
         auVar8._4_4_ = iVar9, auVar8._0_4_ = iVar9, auVar8._8_4_ = iVar10, auVar8._12_4_ = iVar10,
         iVar9 = movmskpd((int)p_Var5,auVar8), iVar9 == 3)) {
        return;
      }
      do {
        bVar7 = p_Var3[1]._M_color < level;
        if (!bVar7) {
          p_Var6 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[bVar7];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var6[1]._M_color <= level)) {
        pmVar4 = utils::std::
                 map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                 ::at(confMap,&local_1c);
        uVar2 = value->m_offset;
        pmVar4->m_width = value->m_width;
        pmVar4->m_offset = uVar2;
        return;
      }
    }
    local_18.second.m_width = (*value).m_width;
    local_18.second.m_offset = (*value).m_offset;
    local_18.first = level;
  }
  std::
  _Rb_tree<el::Level,std::pair<el::Level_const,el::base::SubsecondPrecision>,std::_Select1st<std::pair<el::Level_const,el::base::SubsecondPrecision>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
  ::_M_emplace_unique<std::pair<el::Level,el::base::SubsecondPrecision>>
            ((_Rb_tree<el::Level,std::pair<el::Level_const,el::base::SubsecondPrecision>,std::_Select1st<std::pair<el::Level_const,el::base::SubsecondPrecision>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
              *)confMap,&local_18);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }